

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_monitor.cpp
# Opt level: O0

void __thiscall r_exec::GMonitor::update(GMonitor *this,uint64_t *next_target)

{
  MDLController *pMVar1;
  Fact *pFVar2;
  ulong uVar3;
  uint64_t *next_target_local;
  GMonitor *this_local;
  
  pFVar2 = core::P<r_exec::Fact>::operator->(&(this->super__GMonitor).super_Monitor.target);
  uVar3 = (**(code **)((long)(pFVar2->super__Fact).super_LObject.
                             super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.super_Code
                             .super__Object._vptr__Object + 0x70))();
  if ((uVar3 & 1) == 0) {
    if ((this->super__GMonitor).simulating == 0) {
      pMVar1 = (this->super__GMonitor).super_Monitor.controller;
      pFVar2 = core::P::operator_cast_to_Fact_((P *)&(this->super__GMonitor).super_Monitor.target);
      (*(pMVar1->super_HLPController).super_OController.super_Controller.super__Object._vptr__Object
        [0xf])(pMVar1,pFVar2,0,0);
      PMDLController::remove_g_monitor
                ((PMDLController *)(this->super__GMonitor).super_Monitor.controller,
                 &this->super__GMonitor);
      *next_target = 0;
    }
    else {
      (this->super__GMonitor).simulating = 0;
      commit(this);
      *next_target = (this->super__GMonitor).deadline;
    }
  }
  else {
    PMDLController::remove_g_monitor
              ((PMDLController *)(this->super__GMonitor).super_Monitor.controller,
               &this->super__GMonitor);
    *next_target = 0;
  }
  return;
}

Assistant:

void GMonitor::update(uint64_t &next_target)   // executed by a time core.
{
    if (target->is_invalidated()) {
        ((PMDLController *)controller)->remove_g_monitor(this);
        next_target = 0;
    } else if (simulating) {
        simulating = 0;
        commit();
        next_target = deadline;
    } else {
        ((PMDLController *)controller)->register_goal_outcome(target, false, nullptr);
        ((PMDLController *)controller)->remove_g_monitor(this);
        next_target = 0;
    }
}